

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

bool Clasp::setOptLegacy(OptParams *out,uint32 n)

{
  OptParams OVar1;
  uint uVar2;
  
  if (n < 0x14) {
    uVar2 = 0;
    if (3 >= n) {
      uVar2 = n * 8;
    }
    OVar1 = (OptParams)(uVar2 | 3 < n | (uint)*out & 0x1f0e6);
    *out = OVar1;
    if ((3 < n) && (uVar2 = n - 4, uVar2 != 0)) {
      if ((n & 1) != 0) {
        *out = (OptParams)((uint)OVar1 | 0x100);
      }
      if ((n & 2) != 0) {
        out->field_0x1 = out->field_0x1 | 2;
      }
      if ((uVar2 & 4) != 0) {
        *(byte *)out = *(byte *)out | 0x18;
      }
      if ((uVar2 & 8) != 0) {
        out->field_0x1 = out->field_0x1 | 4;
      }
    }
  }
  return n < 0x14;
}

Assistant:

static bool setOptLegacy(OptParams& out, uint32 n) {
	if (n >= 20) { return false; }
	out.type = n < 4  ? OptParams::type_bb : OptParams::type_usc;
	out.algo = n < 4  ? n : 0;
	out.opts = 0u;
	out.kLim = 0u;
	if (n > 3 && (n -= 4u) != 0u) {
		if (test_bit(n, 0)) { out.opts |= OptParams::usc_disjoint; }
		if (test_bit(n, 1)) { out.opts |= OptParams::usc_succinct; }
		if (test_bit(n, 2)) { out.algo = OptParams::usc_pmr; }
		if (test_bit(n, 3)) { out.opts |= OptParams::usc_stratify; }
	}
	return true;
}